

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O3

Var Js::JavascriptArray::EntryUnshift(RecyclableObject *function,CallInfo callInfo,...)

{
  Type *pTVar1;
  uint uVar2;
  ScriptContext *pSVar3;
  SparseArraySegmentBase *pSVar4;
  code *pcVar5;
  double value;
  SparseArraySegmentBase *this;
  bool bVar6;
  bool bVar7;
  int iVar8;
  undefined4 *puVar9;
  Var pvVar10;
  JavascriptArray *pJVar11;
  RecyclableObject *pRVar12;
  JavascriptCopyOnAccessNativeIntArray *this_00;
  uint64 uVar13;
  uint64 uVar14;
  uint32 unshiftElements;
  uint uVar15;
  int in_stack_00000010;
  BigIndex local_90;
  CallInfo local_80;
  CallInfo callInfo_local;
  JsReentLock jsReentLock;
  ArgumentReader args;
  
  pSVar3 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  local_80 = callInfo;
  ThreadContext::ProbeStack(pSVar3->threadContext,0xc00,pSVar3,(PVOID)0x0);
  if (in_stack_00000010 != callInfo._0_4_) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar9 = 1;
    bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                ,0x1f5d,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar6) goto LAB_00b7c15b;
    *puVar9 = 0;
  }
  jsReentLock._24_8_ = callInfo;
  ArgumentReader::AdjustArguments((ArgumentReader *)&jsReentLock.m_savedNoJsReentrancy,&local_80);
  pSVar3 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  callInfo_local = (CallInfo)pSVar3->threadContext;
  jsReentLock.m_threadContext = (ThreadContext *)0x0;
  jsReentLock.m_arrayObject = (Var)0x0;
  jsReentLock.m_arrayObject2._0_1_ = *(bool *)((long)callInfo_local + 0x108);
  *(bool *)((long)callInfo_local + 0x108) = true;
  pvVar10 = Arguments::operator[]((Arguments *)&jsReentLock.m_savedNoJsReentrancy,0);
  JsReentLock::setObjectForMutation((JsReentLock *)&callInfo_local,pvVar10);
  if (((ulong)local_80 & 0x1000000) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar9 = 1;
    bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                ,0x1f62,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar6) goto LAB_00b7c15b;
    *puVar9 = 0;
  }
  if ((jsReentLock._24_8_ & 0xffffff) == 0) {
    pRVar12 = (((pSVar3->super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase).
              undefinedValue.ptr;
    goto LAB_00b7bd59;
  }
  pvVar10 = Arguments::operator[]((Arguments *)&jsReentLock.m_savedNoJsReentrancy,0);
  bVar6 = IsNonES5Array(pvVar10);
  if (bVar6) {
    pvVar10 = Arguments::operator[]((Arguments *)&jsReentLock.m_savedNoJsReentrancy,0);
    pJVar11 = VarTo<Js::JavascriptArray>(pvVar10);
    iVar8 = (*(pJVar11->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
              super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
              [0x66])(pJVar11);
    if (iVar8 == 0) {
      pvVar10 = Arguments::operator[]((Arguments *)&jsReentLock.m_savedNoJsReentrancy,0);
      if (((pvVar10 != (Var)0x0) &&
          (bVar6 = VarIs<Js::JavascriptCopyOnAccessNativeIntArray>(pvVar10), bVar6)) &&
         (this_00 = UnsafeVarTo<Js::JavascriptCopyOnAccessNativeIntArray>(pvVar10),
         this_00 != (JavascriptCopyOnAccessNativeIntArray *)0x0)) {
        JavascriptCopyOnAccessNativeIntArray::ConvertCopyOnAccessSegment(this_00);
      }
      pvVar10 = Arguments::operator[]((Arguments *)&jsReentLock.m_savedNoJsReentrancy,0);
      pJVar11 = VarTo<Js::JavascriptArray>(pvVar10);
      if (pJVar11 != (JavascriptArray *)0x0) {
        uVar15 = jsReentLock._24_4_ & 0xffffff;
        unshiftElements = uVar15 - 1;
        if (unshiftElements != 0) {
          bVar6 = HasAnyES5ArrayInPrototypeChain(pJVar11,true);
          if (bVar6) goto LAB_00b7bd30;
          uVar2 = (pJVar11->super_ArrayObject).length;
          bVar6 = IsFillFromPrototypes(pJVar11);
          if (bVar6) {
            FillFromPrototypes(pJVar11,0,(pJVar11->super_ArrayObject).length);
          }
          if (uVar2 != (pJVar11->super_ArrayObject).length) {
            Throw::FatalInternalError(-0x7fffbffb);
          }
          uVar15 = -uVar15;
          if (uVar15 < uVar2) {
            EnsureNonNativeArray(pJVar11);
            *(undefined1 *)((long)callInfo_local + 0x108) = jsReentLock.m_arrayObject2._0_1_;
            BigIndex::BigIndex(&local_90,0xffffffff);
            TruncateToProperties(pJVar11,&local_90,uVar15);
            JsReentLock::MutateArrayObject((JsReentLock *)&callInfo_local);
            *(undefined1 *)((long)callInfo_local + 0x108) = 1;
            if ((pJVar11->super_ArrayObject).length + unshiftElements != -1) {
              AssertCount = AssertCount + 1;
              Throw::LogAssert();
              puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
              *puVar9 = 1;
              bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                          ,0x1f93,
                                          "(pArr->length + unshiftElements == MaxArrayLength)",
                                          "pArr->length + unshiftElements == MaxArrayLength");
              if (!bVar6) goto LAB_00b7c15b;
              *puVar9 = 0;
            }
            bVar6 = VarIs<Js::ES5Array,Js::JavascriptArray>(pJVar11);
            if (bVar6) {
              *(undefined1 *)((long)callInfo_local + 0x108) = jsReentLock.m_arrayObject2._0_1_;
              pRVar12 = (RecyclableObject *)
                        UnshiftObjectHelper((Arguments *)&jsReentLock.m_savedNoJsReentrancy,pSVar3);
              goto LAB_00b7bd59;
            }
          }
          ClearSegmentMap(pJVar11);
          if (uVar15 < (pJVar11->super_ArrayObject).length) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
            *puVar9 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                        ,0x1f9c,"(pArr->length <= MaxArrayLength - unshiftElements)"
                                        ,"pArr->length <= MaxArrayLength - unshiftElements");
            if (!bVar6) goto LAB_00b7c15b;
            *puVar9 = 0;
          }
          bVar6 = VarIs<Js::JavascriptNativeIntArray,Js::JavascriptArray>(pJVar11);
          if (bVar6) {
            pSVar4 = (pJVar11->head).ptr;
            if (pSVar4->size < pSVar4->length + unshiftElements) {
              GrowArrayHeadHelperForUnshift<int>(pJVar11,unshiftElements,pSVar3);
            }
LAB_00b7bfeb:
            bVar7 = false;
          }
          else {
            bVar7 = VarIs<Js::JavascriptNativeFloatArray,Js::JavascriptArray>(pJVar11);
            pSVar4 = (pJVar11->head).ptr;
            if (pSVar4->size < pSVar4->length + unshiftElements) {
              if (!bVar7) {
                GrowArrayHeadHelperForUnshift<void*>(pJVar11,unshiftElements,pSVar3);
                goto LAB_00b7bfeb;
              }
              bVar7 = true;
              GrowArrayHeadHelperForUnshift<double>(pJVar11,unshiftElements,pSVar3);
            }
          }
          pSVar4 = (((pJVar11->head).ptr)->next).ptr;
          while (this = pSVar4, this != (SparseArraySegmentBase *)0x0) {
            this->left = this->left + unshiftElements;
            pSVar4 = (this->next).ptr;
            if (pSVar4 == (SparseArraySegmentBase *)0x0) {
              SparseArraySegmentBase::EnsureSizeInBound(this);
              pSVar4 = (this->next).ptr;
            }
          }
          if (bVar6) {
            UnshiftHelper<int>(pJVar11,unshiftElements,(Var *)&stack0x00000018);
          }
          else if (bVar7 == false) {
            UnshiftHelper<void*>(pJVar11,unshiftElements,(Var *)&stack0x00000018);
          }
          else {
            UnshiftHelper<double>(pJVar11,unshiftElements,(Var *)&stack0x00000018);
          }
          SetLastUsedSegment(pJVar11,(pJVar11->head).ptr);
          pTVar1 = &(pJVar11->super_ArrayObject).length;
          *pTVar1 = *pTVar1 + unshiftElements;
          ClearSegmentMap(pJVar11);
          (*(pJVar11->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
            super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x74])
                    (pJVar11);
          if (uVar15 < uVar2) {
            JavascriptError::ThrowRangeError(pSVar3,-0x7ff5ec5a,(PCWSTR)0x0);
          }
        }
        uVar15 = (pJVar11->super_ArrayObject).length;
        if ((long)(int)uVar15 < 0) {
          value = (double)uVar15;
          uVar13 = NumberUtilities::ToSpecial(value);
          bVar6 = NumberUtilities::IsNan(value);
          if (((bVar6) && (uVar14 = NumberUtilities::ToSpecial(value), uVar14 != 0xfff8000000000000)
              ) && (uVar14 = NumberUtilities::ToSpecial(value), uVar14 != 0x7ff8000000000000)) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
            *puVar9 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/JavascriptNumber.inl"
                                        ,0xa2,
                                        "(!IsNan(value) || ToSpecial(value) == k_NegativeNan || ToSpecial(value) == 0x7FF8000000000000ull)"
                                        ,"We should only produce a NaN with this value");
            if (!bVar6) {
LAB_00b7c15b:
              pcVar5 = (code *)invalidInstructionException();
              (*pcVar5)();
            }
            *puVar9 = 0;
          }
          pRVar12 = (RecyclableObject *)(uVar13 ^ 0xfffc000000000000);
        }
        else {
          pRVar12 = (RecyclableObject *)((long)(int)uVar15 | 0x1000000000000);
        }
        goto LAB_00b7bd59;
      }
    }
  }
LAB_00b7bd30:
  *(undefined1 *)((long)callInfo_local + 0x108) = jsReentLock.m_arrayObject2._0_1_;
  pRVar12 = (RecyclableObject *)
            UnshiftObjectHelper((Arguments *)&jsReentLock.m_savedNoJsReentrancy,pSVar3);
LAB_00b7bd59:
  *(undefined1 *)((long)callInfo_local + 0x108) = jsReentLock.m_arrayObject2._0_1_;
  return pRVar12;
}

Assistant:

Var JavascriptArray::EntryUnshift(RecyclableObject* function, CallInfo callInfo, ...)
    {
        JIT_HELPER_REENTRANT_HEADER(Array_Unshift);
        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

        ARGUMENTS(args, callInfo);
        ScriptContext* scriptContext = function->GetScriptContext();
        JS_REENTRANCY_LOCK(jsReentLock, scriptContext->GetThreadContext());
        SETOBJECT_FOR_MUTATION(jsReentLock, args[0]);

        Assert(!(callInfo.Flags & CallFlags_New));

        Var res = scriptContext->GetLibrary()->GetUndefined();

        if (args.Info.Count == 0)
        {
           return res;
        }

        JavascriptArray * pArr = nullptr;
        if (JavascriptArray::IsNonES5Array(args[0])
            && !VarTo<JavascriptArray>(args[0])->IsCrossSiteObject())
        {
#if ENABLE_COPYONACCESS_ARRAY
            JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray<Var>(args[0]);
#endif
            pArr = VarTo<JavascriptArray>(args[0]);
        }

        uint32 unshiftElements = args.Info.Count - 1;

        // forceCheckProtoChain - since the array expand to accommodate new items thus we have to check if we have accessor on the proto chain.
        bool useNoSideEffectUnshift = pArr != nullptr && (unshiftElements == 0 || !HasAnyES5ArrayInPrototypeChain(pArr, true /*forceCheckProtoChain*/));

        if (useNoSideEffectUnshift)
        {
            if (unshiftElements > 0)
            {
                uint32 length = pArr->length;
                if (pArr->IsFillFromPrototypes())
                {
                    pArr->FillFromPrototypes(0, pArr->length); // We need find all missing value from [[proto]] object
                }

                // As we have already established that the FillFromPrototype should not change the bound of the array.
                if (length != pArr->length)
                {
                    Js::Throw::FatalInternalError();
                }

                // Pre-process: truncate overflowing elements to properties
                bool newLenOverflowed = false;
                uint32 maxLen = MaxArrayLength - unshiftElements;
                if (pArr->length > maxLen)
                {
                    newLenOverflowed = true;
                    // Ensure the array is non-native when overflow happens
                    EnsureNonNativeArray(pArr);
                    JS_REENTRANT(jsReentLock, pArr->TruncateToProperties(MaxArrayLength, maxLen));
                    Assert(pArr->length + unshiftElements == MaxArrayLength);
                    if (VarIs<ES5Array>(pArr))
                    {
                        JS_REENTRANT_UNLOCK(jsReentLock, return UnshiftObjectHelper(args, scriptContext));
                    }
                }

                pArr->ClearSegmentMap(); // Dump segmentMap on unshift (before any possible allocation and throw)

                Assert(pArr->length <= MaxArrayLength - unshiftElements);
                bool isIntArray = false;
                bool isFloatArray = false;

                if (VarIs<JavascriptNativeIntArray>(pArr))
                {
                    isIntArray = true;
                }
                else if (VarIs<JavascriptNativeFloatArray>(pArr))
                {
                    isFloatArray = true;
                }

                // If we need to grow head segment and there is already a next segment, then allocate the new head segment upfront
                // If there is OOM in array allocation, then array consistency is maintained.
                if (pArr->head->size < pArr->head->length + unshiftElements)
                {
                    if (isIntArray)
                    {
                        GrowArrayHeadHelperForUnshift<int32>(pArr, unshiftElements, scriptContext);
                    }
                    else if (isFloatArray)
                    {
                        GrowArrayHeadHelperForUnshift<double>(pArr, unshiftElements, scriptContext);
                    }
                    else
                    {
                        GrowArrayHeadHelperForUnshift<Var>(pArr, unshiftElements, scriptContext);
                    }
                }

                SparseArraySegmentBase* renumberSeg = pArr->head->next;

                while (renumberSeg)
                {
                    renumberSeg->left += unshiftElements;
                    if (renumberSeg->next == nullptr)
                    {
                        // last segment can shift its left + size beyond MaxArrayLength, so truncate if so
                        renumberSeg->EnsureSizeInBound();
                    }
                    renumberSeg = renumberSeg->next;
                }

                try
                {
                    if (isIntArray)
                    {
                        UnshiftHelper<int32>(pArr, unshiftElements, args.Values);
                    }
                    else if (isFloatArray)
                    {
                        UnshiftHelper<double>(pArr, unshiftElements, args.Values);
                    }
                    else
                    {
                        UnshiftHelper<Var>(pArr, unshiftElements, args.Values);
                    }
                }
                catch (...)
                {
                    Js::Throw::FatalInternalError();
                }

                pArr->InvalidateLastUsedSegment();
                pArr->length += unshiftElements;
                pArr->ClearSegmentMap();

#ifdef VALIDATE_ARRAY
                pArr->ValidateArray();
#endif

                if (newLenOverflowed) // ES5: throw if new "length" exceeds max array length
                {
                    JavascriptError::ThrowRangeError(scriptContext, JSERR_ArrayLengthAssignIncorrect);
                }
            }
            res = JavascriptNumber::ToVar(pArr->length, scriptContext);
        }
        else
        {
            JS_REENTRANT_UNLOCK(jsReentLock, res = UnshiftObjectHelper(args, scriptContext));
        }
        return res;
        JIT_HELPER_END(Array_Unshift);
    }